

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.h
# Opt level: O1

void __thiscall
cmProcessTools::OutputLogger::OutputLogger(OutputLogger *this,ostream *log,char *prefix)

{
  LineParser::LineParser(&this->super_LineParser,'\n',true);
  (this->super_LineParser).super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_006a21c8;
  LineParser::SetLog(&this->super_LineParser,log,prefix);
  return;
}

Assistant:

OutputLogger(std::ostream& log, const char* prefix = nullptr)
    {
      this->SetLog(&log, prefix);
    }